

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

auto_ptr<avro::OutputStream>
avro::parsing::generate
          (Encoder *e,char *calls,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  long lVar5;
  string *in_RSI;
  OutputStream *in_RDI;
  char c;
  const_iterator it;
  Scanner sc;
  auto_ptr<avro::OutputStream> *ob;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde8;
  undefined1 pv_;
  assertion_result *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe28;
  double in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe44;
  basic_cstring<const_char> local_168 [3];
  lazy_ostream local_138 [2];
  assertion_result local_118;
  basic_cstring<const_char> local_f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0 [4];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  char local_4d;
  undefined1 local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  Scanner local_30 [2];
  string *local_10;
  
  local_10 = in_RSI;
  Scanner::Scanner((Scanner *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffde8);
  local_39 = 0;
  avro::memoryOutputStream((ulong)in_RDI);
  psVar1 = local_10;
  peVar4 = std::auto_ptr<avro::OutputStream>::operator*((auto_ptr<avro::OutputStream> *)in_RDI);
  (*(code *)((*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)psVar1)->
            field_2)._M_allocated_capacity)(psVar1,peVar4);
  while (bVar2 = Scanner::isDone(local_30), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_4d = Scanner::advance(local_30);
    psVar1 = local_10;
    iVar3 = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    switch(local_4d) {
    case 'B':
      local_58 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdf8,iVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_58);
      bVar2 = from_string<bool>(in_stack_ffffffffffffff90._M_current);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)psVar1)[1].
                _M_string_length)(psVar1,bVar2);
      break;
    default:
      do {
        pv_ = (undefined1)((ulong)in_stack_fffffffffffffde8 >> 0x38);
        in_stack_fffffffffffffdf0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_f0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffdf0);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (const_string *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
                   (const_string *)in_stack_fffffffffffffe28);
        boost::test_tools::assertion_result::assertion_result(in_stack_fffffffffffffdf0,(bool)pv_);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffdf8,
                   (char (*) [19])in_stack_fffffffffffffdf0);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>
                    *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_168,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        in_stack_fffffffffffffde8 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_118,local_138,local_168,0x12d,REQUIRE,CHECK_MSG);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_char,_const_char_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_char,_const_char_&>
                    *)0x224d8a);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>
                            *)0x224d97);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x224da4);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      break;
    case 'D':
      in_stack_fffffffffffffe28 = local_10;
      local_78 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdf8,iVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_78);
      in_stack_fffffffffffffe30 = from_string<double>(in_stack_ffffffffffffff90._M_current);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  in_stack_fffffffffffffe28)[2]._M_string_length)(in_stack_fffffffffffffe30);
      break;
    case 'F':
      in_stack_fffffffffffffe38 = local_10;
      in_stack_ffffffffffffff90 =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffdf8,iVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xffffffffffffff90);
      in_stack_fffffffffffffe44 = from_string<float>(in_stack_ffffffffffffff90._M_current);
      (**(code **)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    in_stack_fffffffffffffe38 + 2))(in_stack_fffffffffffffe44);
      break;
    case 'I':
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdf8,iVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_60);
      iVar3 = from_string<int>(in_stack_ffffffffffffff90._M_current);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)psVar1)[1].
                field_2._M_allocated_capacity)(psVar1,iVar3);
      break;
    case 'K':
    case 'S':
      Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      psVar1 = local_10;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xffffffffffffff60);
      from_string<std::__cxx11::string>(in_stack_ffffffffffffff98._M_current);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)psVar1)[2].
                field_2._M_allocated_capacity)(psVar1,&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      break;
    case 'L':
      in_stack_ffffffffffffff98 =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffdf8,iVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xffffffffffffff98);
      lVar5 = from_string<long>(in_stack_ffffffffffffff90._M_current);
      (**(code **)((long)&(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            psVar1)[1].field_2 + 8))(psVar1,lVar5);
      break;
    case 'N':
      (**(code **)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_10 +
                  1))();
      break;
    case 'U':
      in_stack_fffffffffffffdf8 = local_10;
      iVar3 = Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      (**(code **)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    in_stack_fffffffffffffdf8 + 5))(in_stack_fffffffffffffdf8,(long)iVar3);
      break;
    case '[':
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_10)[3]
                .field_2._M_allocated_capacity)();
      break;
    case ']':
      (**(code **)((long)&(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            local_10)[3].field_2 + 8))();
      break;
    case 'b':
      Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdf8,
                              (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_c0);
      from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffe38);
      Encoder::encodeBytes
                ((Encoder *)in_stack_fffffffffffffe10,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe08)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00)
      ;
      break;
    case 'c':
      in_stack_fffffffffffffe00 = local_10;
      iVar3 = Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  in_stack_fffffffffffffe00)[4].field_2._M_allocated_capacity)
                (in_stack_fffffffffffffe00,(long)iVar3);
      break;
    case 'e':
      in_stack_fffffffffffffe08 = local_10;
      iVar3 = Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  in_stack_fffffffffffffe08)[3]._M_string_length)
                (in_stack_fffffffffffffe08,(long)iVar3);
      break;
    case 'f':
      Scanner::extractInt((Scanner *)in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffe10 = local_10;
      local_e0[0] = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffdf8,
                                 (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_e0);
      from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffe38);
      Encoder::encodeFixed
                ((Encoder *)in_stack_fffffffffffffe00,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf8)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00)
      ;
      break;
    case 's':
      (**(code **)((long)&(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            local_10)[4].field_2 + 8))();
      break;
    case '{':
      (**(code **)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_10 +
                  4))();
      break;
    case '}':
      (*(code *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_10)[4]
                ._M_string_length)();
    }
  }
  (**(code **)((long)&(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        local_10)->field_2 + 8))();
  return (auto_ptr<avro::OutputStream>)in_RDI;
}

Assistant:

static auto_ptr<OutputStream> generate(Encoder& e, const char* calls,
    const vector<string>& values)
{
    Scanner sc(calls);
    vector<string>::const_iterator it = values.begin();
    auto_ptr<OutputStream> ob = memoryOutputStream();
    e.init(*ob);

    while (! sc.isDone()) {
        char c = sc.advance();

        switch (c) {
        case 'N':
            e.encodeNull();
            break;
        case 'B':
            e.encodeBool(from_string<bool>(*it++));
            break;
        case 'I':
            e.encodeInt(from_string<int32_t>(*it++));
            break;
        case 'L':
            e.encodeLong(from_string<int64_t>(*it++));
            break;
        case 'F':
            e.encodeFloat(from_string<float>(*it++));
            break;
        case 'D':
            e.encodeDouble(from_string<double>(*it++));
            break;
        case 'S':
        case 'K':
            sc.extractInt();
            e.encodeString(from_string<string>(*it++));
            break;
        case 'b':
            sc.extractInt();
            e.encodeBytes(from_string<vector<uint8_t> >(*it++));
            break;
        case 'f':
            sc.extractInt();
            e.encodeFixed(from_string<vector<uint8_t> >(*it++));
            break;
        case 'e':
            e.encodeEnum(sc.extractInt());
            break;
        case '[':
            e.arrayStart();
            break;
        case ']':
            e.arrayEnd();
            break;
        case '{':
            e.mapStart();
            break;
        case '}':
            e.mapEnd();
            break;
        case 'c':
            e.setItemCount(sc.extractInt());
            break;
        case 's':
            e.startItem();
            break;
        case 'U':
            e.encodeUnionIndex(sc.extractInt());
            break;
        default:
            BOOST_FAIL("Unknown mnemonic: " << c);
        }
    }
    e.flush();
    return ob;
}